

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::finish(recall_tree *b)

{
  node *pnVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0x38;
  for (uVar2 = 0; pnVar1 = (b->nodes)._begin,
      uVar2 < (ulong)(((long)(b->nodes)._end - (long)pnVar1) / 0x58); uVar2 = uVar2 + 1) {
    v_array<recall_tree_ns::node_pred>::delete_v
              ((v_array<recall_tree_ns::node_pred> *)((long)&pnVar1->parent + lVar3));
    lVar3 = lVar3 + 0x58;
  }
  v_array<recall_tree_ns::node>::delete_v(&b->nodes);
  return;
}

Assistant:

void finish(recall_tree& b)
{
  for (size_t i = 0; i < b.nodes.size(); ++i) b.nodes[i].preds.delete_v();
  b.nodes.delete_v();
}